

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O1

Slice __thiscall leveldb::MemTableIterator::key(MemTableIterator *this)

{
  Node *pNVar1;
  long in_FS_OFFSET;
  Slice SVar2;
  
  pNVar1 = (this->iter_).node_;
  if (pNVar1 == (Node *)0x0) {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/skiplist.h"
                  ,0xca,
                  "const Key &leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::Iterator::key() const [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    SVar2 = GetLengthPrefixedSlice(pNVar1->key);
    return SVar2;
  }
  __stack_chk_fail();
}

Assistant:

Slice key() const override { return GetLengthPrefixedSlice(iter_.key()); }